

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O1

mat4 * projection(double coeff)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  mat4 *in_RDI;
  long lVar4;
  bool bVar5;
  uint uVar6;
  
  in_RDI->rows[3].data[2] = 0.0;
  in_RDI->rows[3].data[3] = 0.0;
  in_RDI->rows[3].data[0] = 0.0;
  in_RDI->rows[3].data[1] = 0.0;
  in_RDI->rows[2].data[2] = 0.0;
  in_RDI->rows[2].data[3] = 0.0;
  in_RDI->rows[2].data[0] = 0.0;
  in_RDI->rows[2].data[1] = 0.0;
  in_RDI->rows[1].data[2] = 0.0;
  in_RDI->rows[1].data[3] = 0.0;
  in_RDI->rows[1].data[0] = 0.0;
  in_RDI->rows[1].data[1] = 0.0;
  in_RDI->rows[0].data[2] = 0.0;
  in_RDI->rows[0].data[3] = 0.0;
  in_RDI->rows[0].data[0] = 0.0;
  in_RDI->rows[0].data[1] = 0.0;
  pdVar1 = in_RDI->rows[3].data + 3;
  lVar2 = 3;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      uVar6 = 0x3ff00000;
      if (lVar3 != lVar4) {
        uVar6 = 0;
      }
      pdVar1[lVar4] = (double)((ulong)uVar6 << 0x20);
      lVar4 = lVar4 + -1;
    } while (lVar4 != -4);
    pdVar1 = pdVar1 + -4;
    lVar3 = lVar3 + -1;
    bVar5 = lVar2 != 0;
    lVar2 = lVar2 + -1;
  } while (bVar5);
  in_RDI->rows[3].data[2] = coeff;
  return in_RDI;
}

Assistant:

mat4 projection(double coeff)
{
    mat4 Projection = mat4::identity();
    Projection[3][2] = coeff;
    return Projection;
}